

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.cc
# Opt level: O0

uchar * SHA256(uchar *d,size_t n,uchar *md)

{
  undefined1 local_90 [8];
  SHA256_CTX ctx;
  uint8_t *out_local;
  size_t len_local;
  uint8_t *data_local;
  
  ctx._104_8_ = md;
  BCM_sha256_init((SHA256_CTX *)local_90);
  BCM_sha256_update((SHA256_CTX *)local_90,d,n);
  BCM_sha256_final((uint8_t *)ctx._104_8_,(SHA256_CTX *)local_90);
  OPENSSL_cleanse(local_90,0x70);
  return (uchar *)ctx._104_8_;
}

Assistant:

uint8_t *SHA256(const uint8_t *data, size_t len,
                uint8_t out[SHA256_DIGEST_LENGTH]) {
  SHA256_CTX ctx;
  BCM_sha256_init(&ctx);
  BCM_sha256_update(&ctx, data, len);
  BCM_sha256_final(out, &ctx);
  OPENSSL_cleanse(&ctx, sizeof(ctx));
  return out;
}